

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_tailcall(jit_State *J,RecordFFData *rd,cTValue *tv)

{
  TRef TVar1;
  long in_RSI;
  GCobj *in_RDI;
  jit_State *unaff_retaddr;
  TRef kfunc;
  
  TVar1 = lj_ir_kgc(unaff_retaddr,in_RDI,(IRType)((ulong)in_RSI >> 0x20));
  *(TRef *)(*(long *)((long)in_RDI + 0x88) + -4) = TVar1 | 0x10000;
  *(undefined8 *)(in_RSI + 8) = 0xffffffffffffffff;
  return;
}

Assistant:

static void crec_tailcall(jit_State *J, RecordFFData *rd, cTValue *tv)
{
  TRef kfunc = lj_ir_kfunc(J, funcV(tv));
#if LJ_FR2
  J->base[-2] = kfunc;
  J->base[-1] = TREF_FRAME;
#else
  J->base[-1] = kfunc | TREF_FRAME;
#endif
  rd->nres = -1;  /* Pending tailcall. */
}